

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_find.c
# Opt level: O1

void * mpt_queue_find(mpt_queue *queue,size_t esz,_func_int_void_ptr_void_ptr *cmp,void *carg)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  
  iVar1 = 0xe;
  if (cmp != (_func_int_void_ptr_void_ptr *)0x0 && queue != (mpt_queue *)0x0) {
    uVar3 = queue->len;
    iVar1 = 0xb;
    if (esz <= uVar3) {
      uVar4 = queue->off;
      pvVar5 = (void *)((long)queue->base + uVar4);
      if (queue->max - uVar3 < uVar4) {
        uVar4 = queue->max - uVar4;
        if (esz <= uVar4) {
          uVar3 = 0;
          do {
            iVar1 = (*cmp)(pvVar5,carg);
            if (iVar1 == 0) {
              return pvVar5;
            }
            uVar3 = uVar3 + 1;
            pvVar5 = (void *)((long)pvVar5 + esz);
          } while (uVar3 < uVar4 / esz);
        }
        uVar3 = queue->max - queue->off;
        iVar1 = 0x5f;
        if (uVar3 % esz != 0) goto LAB_0011aff3;
        pvVar5 = queue->base;
        uVar3 = queue->len - uVar3;
      }
      if (uVar3 < esz) {
        return (void *)0x0;
      }
      uVar4 = 0;
      do {
        iVar1 = (*cmp)(pvVar5,carg);
        if (iVar1 == 0) {
          return pvVar5;
        }
        uVar4 = uVar4 + 1;
        pvVar5 = (void *)((long)pvVar5 + esz);
      } while (uVar4 < uVar3 / esz);
      return (void *)0x0;
    }
  }
LAB_0011aff3:
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  return (void *)0x0;
}

Assistant:

extern void *mpt_queue_find(const MPT_STRUCT(queue) *queue, size_t esz, int (*cmp)(const void *, void *), void *carg)
{
	size_t pos, iter;
	char *addr;
	
	if (!queue || !cmp) {
		errno = EFAULT;
		return 0;
	}
	
	addr = queue->base;
	
	if (queue->len < esz) {
		errno = EAGAIN;
		return 0;
	}
	
	addr += queue->off;
	
	/* queue is aligned */
	if (!MPT_queue_frag(queue)) {
		iter = queue->len/esz;
	}
	else {
		/* elements in upper data part */
		iter = (queue->max - queue->off)/esz;
		
		for (pos = 0; pos < iter; pos++, addr += esz) {
			if (!cmp(addr, carg)) {
				return addr;
			}
		}
		iter = queue->max - queue->off;
		
		/* element wrapping over queue border */
		if (iter % esz) {
			errno = ENOTSUP;
			return 0;
		}
		/* remaining elements in lower data part */
		iter = (queue->len - iter)/esz;
		addr = queue->base;
	}
	
	for (pos = 0; pos < iter; pos++, addr += esz) {
		if (!cmp(addr, carg)) {
			return addr;
		}
	}
	
	return 0;
}